

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ImU32 IVar29;
  ImGuiMouseCursor IVar30;
  ImGuiContext *pIVar31;
  ImGuiIO *pIVar32;
  ImDrawList *pIVar33;
  void *pvVar34;
  ulong uVar35;
  char cVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int n;
  int obj_i;
  int iVar40;
  bool *pbVar41;
  int i;
  void *ptr_id;
  long lVar42;
  char *pcVar43;
  char *pcVar44;
  int i_14;
  int i_3;
  int i_2;
  long lVar45;
  undefined8 *puVar46;
  MyDocument *doc;
  int j;
  uint uVar47;
  long lVar48;
  undefined **ppuVar49;
  float fVar50;
  float fVar51;
  double dVar52;
  ImVec2 IVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  ImVec2 cr_max;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar84;
  undefined1 auVar82 [16];
  int iVar85;
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int iVar99;
  int iVar103;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ImVec2 canvas_size;
  char label [128];
  ImVec2 local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  ImVec2 local_f0;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_58;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImVec2 local_38;
  long lVar65;
  
  pIVar31 = GetCurrentContext();
  if (pIVar31 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                  ,0xc5,"void ImGui::ShowDemoWindow(bool *)");
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar40 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar40 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar26 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar26) {
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar40 = 0;
          }
          else {
            lVar42 = 0;
            iVar40 = 0;
            do {
              iVar40 = iVar40 + (uint)*(byte *)(DAT_001efb60 + 8 + lVar42);
              lVar42 = lVar42 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar42);
          }
          bVar26 = BeginMenu("Open",iVar40 < ShowExampleAppDocuments(bool*)::app);
          if (bVar26) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar45 = 8;
              lVar48 = 0;
              lVar42 = DAT_001efb60;
              do {
                lVar38 = lVar42;
                if ((*(char *)(lVar42 + lVar45) == '\0') &&
                   (bVar26 = MenuItem(*(char **)(lVar42 + -8 + lVar45),(char *)0x0,false,true),
                   lVar38 = DAT_001efb60, bVar26)) {
                  *(undefined1 *)(lVar42 + lVar45) = 1;
                }
                lVar48 = lVar48 + 1;
                lVar45 = lVar45 + 0x20;
                lVar42 = lVar38;
              } while (lVar48 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar26 = MenuItem("Close All Documents",(char *)0x0,false,iVar40 != 0);
          lVar42 = DAT_001efb60;
          auVar25 = _DAT_001920f0;
          if ((bVar26) && (0 < (long)ShowExampleAppDocuments(bool*)::app)) {
            uVar37 = ShowExampleAppDocuments(bool*)::app + 0xf;
            lVar45 = (long)ShowExampleAppDocuments(bool*)::app + -1;
            uStack_110._0_4_ = (float)(int)lVar45;
            local_118 = (undefined1  [8])lVar45;
            uStack_110._4_4_ = (float)(int)((ulong)lVar45 >> 0x20);
            lVar45 = 0;
            auVar54 = _local_118;
            auVar64 = _DAT_001969a0;
            auVar66 = _DAT_001969b0;
            auVar67 = _DAT_001969c0;
            auVar68 = _DAT_001969d0;
            auVar69 = _DAT_001969e0;
            auVar70 = _DAT_001969f0;
            auVar71 = _DAT_001920d0;
            auVar72 = _DAT_001920e0;
            do {
              auVar82 = _local_118 ^ auVar25;
              auVar86 = auVar72 ^ auVar25;
              iVar40 = auVar82._0_4_;
              iVar99 = -(uint)(iVar40 < auVar86._0_4_);
              iVar63 = auVar82._4_4_;
              auVar88._4_4_ = -(uint)(iVar63 < auVar86._4_4_);
              iVar84 = auVar82._8_4_;
              iVar103 = -(uint)(iVar84 < auVar86._8_4_);
              iVar85 = auVar82._12_4_;
              auVar88._12_4_ = -(uint)(iVar85 < auVar86._12_4_);
              auVar82._4_4_ = iVar99;
              auVar82._0_4_ = iVar99;
              auVar82._8_4_ = iVar103;
              auVar82._12_4_ = iVar103;
              auVar82 = pshuflw(auVar54,auVar82,0xe8);
              auVar87._4_4_ = -(uint)(auVar86._4_4_ == iVar63);
              auVar87._12_4_ = -(uint)(auVar86._12_4_ == iVar85);
              auVar87._0_4_ = auVar87._4_4_;
              auVar87._8_4_ = auVar87._12_4_;
              auVar73 = pshuflw(in_XMM11,auVar87,0xe8);
              auVar88._0_4_ = auVar88._4_4_;
              auVar88._8_4_ = auVar88._12_4_;
              auVar86 = pshuflw(auVar82,auVar88,0xe8);
              auVar54._8_4_ = 0xffffffff;
              auVar54._0_8_ = 0xffffffffffffffff;
              auVar54._12_4_ = 0xffffffff;
              auVar54 = (auVar86 | auVar73 & auVar82) ^ auVar54;
              auVar54 = packssdw(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0xb + lVar45) = 1;
              }
              auVar73._4_4_ = iVar99;
              auVar73._0_4_ = iVar99;
              auVar73._8_4_ = iVar103;
              auVar73._12_4_ = iVar103;
              auVar88 = auVar87 & auVar73 | auVar88;
              auVar54 = packssdw(auVar88,auVar88);
              auVar86._8_4_ = 0xffffffff;
              auVar86._0_8_ = 0xffffffffffffffff;
              auVar86._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 ^ auVar86,auVar54 ^ auVar86);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._0_4_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x2b + lVar45) = 1;
              }
              auVar54 = auVar71 ^ auVar25;
              auVar74._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar74._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar74._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar74._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar89._4_4_ = auVar74._0_4_;
              auVar89._0_4_ = auVar74._0_4_;
              auVar89._8_4_ = auVar74._8_4_;
              auVar89._12_4_ = auVar74._8_4_;
              iVar99 = -(uint)(auVar54._4_4_ == iVar63);
              iVar103 = -(uint)(auVar54._12_4_ == iVar85);
              auVar12._4_4_ = iVar99;
              auVar12._0_4_ = iVar99;
              auVar12._8_4_ = iVar103;
              auVar12._12_4_ = iVar103;
              auVar100._4_4_ = auVar74._4_4_;
              auVar100._0_4_ = auVar74._4_4_;
              auVar100._8_4_ = auVar74._12_4_;
              auVar100._12_4_ = auVar74._12_4_;
              auVar54 = auVar12 & auVar89 | auVar100;
              auVar54 = packssdw(auVar54,auVar54);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 ^ auVar3,auVar54 ^ auVar3);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x4b + lVar45) = 1;
              }
              auVar54 = pshufhw(auVar54,auVar89,0x84);
              auVar13._4_4_ = iVar99;
              auVar13._0_4_ = iVar99;
              auVar13._8_4_ = iVar103;
              auVar13._12_4_ = iVar103;
              auVar86 = pshufhw(auVar74,auVar13,0x84);
              auVar82 = pshufhw(auVar54,auVar100,0x84);
              auVar55._8_4_ = 0xffffffff;
              auVar55._0_8_ = 0xffffffffffffffff;
              auVar55._12_4_ = 0xffffffff;
              auVar55 = (auVar82 | auVar86 & auVar54) ^ auVar55;
              auVar54 = packssdw(auVar55,auVar55);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x6b + lVar45) = 1;
              }
              auVar54 = auVar70 ^ auVar25;
              auVar75._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar75._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar75._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar75._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar14._4_4_ = auVar75._0_4_;
              auVar14._0_4_ = auVar75._0_4_;
              auVar14._8_4_ = auVar75._8_4_;
              auVar14._12_4_ = auVar75._8_4_;
              auVar86 = pshuflw(auVar100,auVar14,0xe8);
              auVar56._0_4_ = -(uint)(auVar54._0_4_ == iVar40);
              auVar56._4_4_ = -(uint)(auVar54._4_4_ == iVar63);
              auVar56._8_4_ = -(uint)(auVar54._8_4_ == iVar84);
              auVar56._12_4_ = -(uint)(auVar54._12_4_ == iVar85);
              auVar90._4_4_ = auVar56._4_4_;
              auVar90._0_4_ = auVar56._4_4_;
              auVar90._8_4_ = auVar56._12_4_;
              auVar90._12_4_ = auVar56._12_4_;
              auVar54 = pshuflw(auVar56,auVar90,0xe8);
              auVar91._4_4_ = auVar75._4_4_;
              auVar91._0_4_ = auVar75._4_4_;
              auVar91._8_4_ = auVar75._12_4_;
              auVar91._12_4_ = auVar75._12_4_;
              auVar82 = pshuflw(auVar75,auVar91,0xe8);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 & auVar86,(auVar82 | auVar54 & auVar86) ^ auVar4);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0x8b + lVar45) = 1;
              }
              auVar15._4_4_ = auVar75._0_4_;
              auVar15._0_4_ = auVar75._0_4_;
              auVar15._8_4_ = auVar75._8_4_;
              auVar15._12_4_ = auVar75._8_4_;
              auVar91 = auVar90 & auVar15 | auVar91;
              auVar82 = packssdw(auVar91,auVar91);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54,auVar82 ^ auVar5);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._4_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0xab + lVar45) = 1;
              }
              auVar54 = auVar69 ^ auVar25;
              auVar76._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar76._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar76._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar76._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar92._4_4_ = auVar76._0_4_;
              auVar92._0_4_ = auVar76._0_4_;
              auVar92._8_4_ = auVar76._8_4_;
              auVar92._12_4_ = auVar76._8_4_;
              iVar99 = -(uint)(auVar54._4_4_ == iVar63);
              iVar103 = -(uint)(auVar54._12_4_ == iVar85);
              auVar16._4_4_ = iVar99;
              auVar16._0_4_ = iVar99;
              auVar16._8_4_ = iVar103;
              auVar16._12_4_ = iVar103;
              auVar101._4_4_ = auVar76._4_4_;
              auVar101._0_4_ = auVar76._4_4_;
              auVar101._8_4_ = auVar76._12_4_;
              auVar101._12_4_ = auVar76._12_4_;
              auVar54 = auVar16 & auVar92 | auVar101;
              auVar54 = packssdw(auVar54,auVar54);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 ^ auVar6,auVar54 ^ auVar6);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0xcb + lVar45) = 1;
              }
              auVar54 = pshufhw(auVar54,auVar92,0x84);
              auVar17._4_4_ = iVar99;
              auVar17._0_4_ = iVar99;
              auVar17._8_4_ = iVar103;
              auVar17._12_4_ = iVar103;
              auVar86 = pshufhw(auVar76,auVar17,0x84);
              auVar82 = pshufhw(auVar54,auVar101,0x84);
              auVar57._8_4_ = 0xffffffff;
              auVar57._0_8_ = 0xffffffffffffffff;
              auVar57._12_4_ = 0xffffffff;
              auVar57 = (auVar82 | auVar86 & auVar54) ^ auVar57;
              auVar54 = packssdw(auVar57,auVar57);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._6_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0xeb + lVar45) = 1;
              }
              auVar54 = auVar68 ^ auVar25;
              auVar77._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar77._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar77._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar77._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar18._4_4_ = auVar77._0_4_;
              auVar18._0_4_ = auVar77._0_4_;
              auVar18._8_4_ = auVar77._8_4_;
              auVar18._12_4_ = auVar77._8_4_;
              auVar86 = pshuflw(auVar101,auVar18,0xe8);
              auVar58._0_4_ = -(uint)(auVar54._0_4_ == iVar40);
              auVar58._4_4_ = -(uint)(auVar54._4_4_ == iVar63);
              auVar58._8_4_ = -(uint)(auVar54._8_4_ == iVar84);
              auVar58._12_4_ = -(uint)(auVar54._12_4_ == iVar85);
              auVar93._4_4_ = auVar58._4_4_;
              auVar93._0_4_ = auVar58._4_4_;
              auVar93._8_4_ = auVar58._12_4_;
              auVar93._12_4_ = auVar58._12_4_;
              auVar54 = pshuflw(auVar58,auVar93,0xe8);
              auVar94._4_4_ = auVar77._4_4_;
              auVar94._0_4_ = auVar77._4_4_;
              auVar94._8_4_ = auVar77._12_4_;
              auVar94._12_4_ = auVar77._12_4_;
              auVar82 = pshuflw(auVar77,auVar94,0xe8);
              auVar78._8_4_ = 0xffffffff;
              auVar78._0_8_ = 0xffffffffffffffff;
              auVar78._12_4_ = 0xffffffff;
              auVar78 = (auVar82 | auVar54 & auVar86) ^ auVar78;
              auVar82 = packssdw(auVar78,auVar78);
              auVar54 = packsswb(auVar54 & auVar86,auVar82);
              if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0x10b + lVar45) = 1;
              }
              auVar19._4_4_ = auVar77._0_4_;
              auVar19._0_4_ = auVar77._0_4_;
              auVar19._8_4_ = auVar77._8_4_;
              auVar19._12_4_ = auVar77._8_4_;
              auVar94 = auVar93 & auVar19 | auVar94;
              auVar82 = packssdw(auVar94,auVar94);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar82 = packssdw(auVar82 ^ auVar7,auVar82 ^ auVar7);
              auVar54 = packsswb(auVar54,auVar82);
              if ((auVar54._8_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 299 + lVar45) = 1;
              }
              auVar54 = auVar67 ^ auVar25;
              auVar79._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar79._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar79._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar79._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar95._4_4_ = auVar79._0_4_;
              auVar95._0_4_ = auVar79._0_4_;
              auVar95._8_4_ = auVar79._8_4_;
              auVar95._12_4_ = auVar79._8_4_;
              iVar99 = -(uint)(auVar54._4_4_ == iVar63);
              iVar103 = -(uint)(auVar54._12_4_ == iVar85);
              auVar20._4_4_ = iVar99;
              auVar20._0_4_ = iVar99;
              auVar20._8_4_ = iVar103;
              auVar20._12_4_ = iVar103;
              auVar102._4_4_ = auVar79._4_4_;
              auVar102._0_4_ = auVar79._4_4_;
              auVar102._8_4_ = auVar79._12_4_;
              auVar102._12_4_ = auVar79._12_4_;
              auVar54 = auVar20 & auVar95 | auVar102;
              auVar54 = packssdw(auVar54,auVar54);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 ^ auVar8,auVar54 ^ auVar8);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0x14b + lVar45) = 1;
              }
              auVar54 = pshufhw(auVar54,auVar95,0x84);
              auVar21._4_4_ = iVar99;
              auVar21._0_4_ = iVar99;
              auVar21._8_4_ = iVar103;
              auVar21._12_4_ = iVar103;
              auVar86 = pshufhw(auVar79,auVar21,0x84);
              auVar82 = pshufhw(auVar54,auVar102,0x84);
              auVar59._8_4_ = 0xffffffff;
              auVar59._0_8_ = 0xffffffffffffffff;
              auVar59._12_4_ = 0xffffffff;
              auVar59 = (auVar82 | auVar86 & auVar54) ^ auVar59;
              auVar54 = packssdw(auVar59,auVar59);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._10_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x16b + lVar45) = 1;
              }
              auVar54 = auVar66 ^ auVar25;
              auVar80._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar80._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar80._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar80._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar22._4_4_ = auVar80._0_4_;
              auVar22._0_4_ = auVar80._0_4_;
              auVar22._8_4_ = auVar80._8_4_;
              auVar22._12_4_ = auVar80._8_4_;
              auVar86 = pshuflw(auVar102,auVar22,0xe8);
              auVar60._0_4_ = -(uint)(auVar54._0_4_ == iVar40);
              auVar60._4_4_ = -(uint)(auVar54._4_4_ == iVar63);
              auVar60._8_4_ = -(uint)(auVar54._8_4_ == iVar84);
              auVar60._12_4_ = -(uint)(auVar54._12_4_ == iVar85);
              auVar96._4_4_ = auVar60._4_4_;
              auVar96._0_4_ = auVar60._4_4_;
              auVar96._8_4_ = auVar60._12_4_;
              auVar96._12_4_ = auVar60._12_4_;
              auVar54 = pshuflw(auVar60,auVar96,0xe8);
              auVar97._4_4_ = auVar80._4_4_;
              auVar97._0_4_ = auVar80._4_4_;
              auVar97._8_4_ = auVar80._12_4_;
              auVar97._12_4_ = auVar80._12_4_;
              auVar82 = pshuflw(auVar80,auVar97,0xe8);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 & auVar86,(auVar82 | auVar54 & auVar86) ^ auVar9);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0x18b + lVar45) = 1;
              }
              auVar23._4_4_ = auVar80._0_4_;
              auVar23._0_4_ = auVar80._0_4_;
              auVar23._8_4_ = auVar80._8_4_;
              auVar23._12_4_ = auVar80._8_4_;
              auVar97 = auVar96 & auVar23 | auVar97;
              auVar82 = packssdw(auVar97,auVar97);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54,auVar82 ^ auVar10);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._12_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x1ab + lVar45) = 1;
              }
              auVar54 = auVar64 ^ auVar25;
              auVar81._0_4_ = -(uint)(iVar40 < auVar54._0_4_);
              auVar81._4_4_ = -(uint)(iVar63 < auVar54._4_4_);
              auVar81._8_4_ = -(uint)(iVar84 < auVar54._8_4_);
              auVar81._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
              auVar98._4_4_ = auVar81._0_4_;
              auVar98._0_4_ = auVar81._0_4_;
              auVar98._8_4_ = auVar81._8_4_;
              auVar98._12_4_ = auVar81._8_4_;
              iVar40 = -(uint)(auVar54._4_4_ == iVar63);
              iVar63 = -(uint)(auVar54._12_4_ == iVar85);
              auVar83._4_4_ = iVar40;
              auVar83._0_4_ = iVar40;
              auVar83._8_4_ = iVar63;
              auVar83._12_4_ = iVar63;
              auVar61._4_4_ = auVar81._4_4_;
              auVar61._0_4_ = auVar81._4_4_;
              auVar61._8_4_ = auVar81._12_4_;
              auVar61._12_4_ = auVar81._12_4_;
              auVar61 = auVar83 & auVar98 | auVar61;
              auVar54 = packssdw(auVar61,auVar61);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar54 = packssdw(auVar54 ^ auVar11,auVar54 ^ auVar11);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar42 + 0x1cb + lVar45) = 1;
              }
              auVar54 = pshufhw(auVar54,auVar98,0x84);
              in_XMM11 = pshufhw(auVar81,auVar83,0x84);
              in_XMM11 = in_XMM11 & auVar54;
              auVar24._4_4_ = auVar81._4_4_;
              auVar24._0_4_ = auVar81._4_4_;
              auVar24._8_4_ = auVar81._12_4_;
              auVar24._12_4_ = auVar81._12_4_;
              auVar54 = pshufhw(auVar54,auVar24,0x84);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar54 | in_XMM11) ^ auVar62;
              auVar54 = packssdw(auVar62,auVar62);
              auVar54 = packsswb(auVar54,auVar54);
              if ((auVar54._14_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar42 + 0x1eb + lVar45) = 1;
              }
              lVar48 = (long)DAT_00196a00;
              lVar65 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + lVar48;
              lVar38 = DAT_00196a00._8_8_;
              auVar72._8_8_ = lVar65 + lVar38;
              lVar65 = auVar71._8_8_;
              auVar71._0_8_ = auVar71._0_8_ + lVar48;
              auVar71._8_8_ = lVar65 + lVar38;
              lVar65 = auVar70._8_8_;
              auVar70._0_8_ = auVar70._0_8_ + lVar48;
              auVar70._8_8_ = lVar65 + lVar38;
              lVar65 = auVar69._8_8_;
              auVar69._0_8_ = auVar69._0_8_ + lVar48;
              auVar69._8_8_ = lVar65 + lVar38;
              lVar65 = auVar68._8_8_;
              auVar68._0_8_ = auVar68._0_8_ + lVar48;
              auVar68._8_8_ = lVar65 + lVar38;
              lVar65 = auVar67._8_8_;
              auVar67._0_8_ = auVar67._0_8_ + lVar48;
              auVar67._8_8_ = lVar65 + lVar38;
              lVar65 = auVar66._8_8_;
              auVar66._0_8_ = auVar66._0_8_ + lVar48;
              auVar66._8_8_ = lVar65 + lVar38;
              lVar65 = auVar64._8_8_;
              auVar64._0_8_ = auVar64._0_8_ + lVar48;
              auVar64._8_8_ = lVar65 + lVar38;
              lVar45 = lVar45 + 0x200;
              auVar54 = _DAT_00196a00;
            } while ((ulong)(uVar37 >> 4) << 9 != lVar45);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_58 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar45 = 8;
        lVar42 = 0;
        do {
          lVar48 = DAT_001efb60;
          if (lVar42 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar46 = (undefined8 *)(lVar45 + lVar48 + -8);
          PushID(puVar46);
          bVar26 = Checkbox((char *)*puVar46,(bool *)(lVar45 + lVar48));
          if ((bVar26) && (*(bool *)(lVar45 + lVar48) == false)) {
            *(undefined1 *)(lVar48 + lVar45) = 0;
            *(undefined1 *)(lVar48 + 2 + lVar45) = 0;
          }
          PopID();
          lVar42 = lVar42 + 1;
          lVar45 = lVar45 + 0x20;
        } while (lVar42 < ShowExampleAppDocuments(bool*)::app);
      }
      Separator();
      bVar26 = BeginTabBar("##tabs",0x41);
      p_open = local_58;
      if (bVar26) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar45 = 9;
          lVar48 = 0;
          lVar42 = DAT_001efb60;
          iVar40 = ShowExampleAppDocuments(bool*)::app;
          do {
            cVar36 = *(char *)(lVar42 + -1 + lVar45);
            lVar38 = lVar42;
            if ((cVar36 == '\0') && (*(char *)(lVar42 + lVar45) == '\x01')) {
              SetTabItemClosed(*(char **)(lVar42 + -9 + lVar45));
              cVar36 = *(char *)(lVar42 + -1 + lVar45);
              lVar38 = DAT_001efb60;
              iVar40 = ShowExampleAppDocuments(bool*)::app;
            }
            *(char *)(lVar42 + lVar45) = cVar36;
            lVar48 = lVar48 + 1;
            lVar45 = lVar45 + 0x20;
            lVar42 = lVar38;
          } while (lVar48 < iVar40);
          if (0 < iVar40) {
            lVar45 = 8;
            lVar42 = 0;
            do {
              lVar48 = DAT_001efb60;
              if (*(char *)(DAT_001efb60 + lVar45) == '\x01') {
                bVar26 = BeginTabItem(*(char **)(DAT_001efb60 + -8 + lVar45),
                                      (bool *)(DAT_001efb60 + lVar45),
                                      (uint)*(byte *)(DAT_001efb60 + 2 + lVar45));
                if ((*(char *)(lVar48 + lVar45) == '\0') &&
                   (*(char *)(lVar48 + 2 + lVar45) == '\x01')) {
                  *(undefined1 *)(lVar48 + lVar45) = 1;
                  *(undefined1 *)(lVar48 + 3 + lVar45) = 1;
                }
                doc = (MyDocument *)(lVar48 + lVar45 + -8);
                MyDocument::DisplayContextMenu(doc);
                if (bVar26) {
                  MyDocument::DisplayContents(doc);
                  EndTabItem();
                }
              }
              lVar42 = lVar42 + 1;
              lVar45 = lVar45 + 0x20;
            } while (lVar42 < ShowExampleAppDocuments(bool*)::app);
          }
        }
        EndTabBar();
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      uVar35 = _close_queue & 0xffffffff;
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar48 = 0;
          uVar35 = 0;
          lVar45 = 0;
          lVar42 = DAT_001efb60;
          iVar40 = ShowExampleAppDocuments(bool*)::app;
          do {
            iVar63 = (int)uVar35;
            if (*(char *)(lVar42 + 0xb + lVar48) == '\x01') {
              *(undefined1 *)(lVar42 + 0xb + lVar48) = 0;
              if (iVar63 == DAT_001efb74) {
                if (iVar63 == 0) {
                  iVar40 = 8;
                }
                else {
                  iVar40 = ((int)(uVar35 >> 0x1f) + iVar63 >> 1) + iVar63;
                }
                iVar84 = iVar63 + 1;
                if (iVar63 + 1 < iVar40) {
                  iVar84 = iVar40;
                }
                pvVar34 = MemAlloc((long)iVar84 << 3);
                if (DAT_001efb78 != (void *)0x0) {
                  memcpy(pvVar34,DAT_001efb78,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_001efb78);
                }
                _close_queue = CONCAT44(iVar84,ShowExampleAppDocuments(bool*)::close_queue);
                iVar63 = ShowExampleAppDocuments(bool*)::close_queue;
                DAT_001efb78 = pvVar34;
              }
              *(long *)((long)DAT_001efb78 + (long)iVar63 * 8) = lVar42 + lVar48;
              uVar35 = (ulong)(ShowExampleAppDocuments(bool*)::close_queue + 1U);
              _close_queue = CONCAT44(DAT_001efb74,ShowExampleAppDocuments(bool*)::close_queue + 1U)
              ;
              lVar42 = DAT_001efb60;
              iVar40 = ShowExampleAppDocuments(bool*)::app;
            }
            lVar45 = lVar45 + 1;
            lVar48 = lVar48 + 0x20;
          } while (lVar45 < iVar40);
          if ((int)uVar35 != 0) goto LAB_00122e54;
        }
      }
      else {
LAB_00122e54:
        pvVar34 = DAT_001efb78;
        if ((int)uVar35 < 1) {
          if (DAT_001efb78 != (void *)0x0) goto LAB_001230a7;
        }
        else {
          uVar39 = 0;
          iVar40 = 0;
          do {
            iVar40 = iVar40 + (uint)*(byte *)(*(long *)((long)DAT_001efb78 + uVar39 * 8) + 10);
            uVar39 = uVar39 + 1;
          } while (uVar35 != uVar39);
          if (iVar40 == 0) {
            uVar39 = 0;
            do {
              lVar42 = *(long *)((long)pvVar34 + uVar39 * 8);
              *(undefined1 *)(lVar42 + 8) = 0;
              *(undefined1 *)(lVar42 + 10) = 0;
              uVar39 = uVar39 + 1;
            } while (uVar35 != uVar39);
LAB_001230a7:
            _close_queue = 0;
            MemFree(pvVar34);
            DAT_001efb78 = (void *)0x0;
          }
          else {
            bVar26 = IsPopupOpen("Save?");
            if (!bVar26) {
              OpenPopup("Save?");
            }
            bVar26 = BeginPopupModal("Save?",(bool *)0x0,0);
            if (!bVar26) goto LAB_001231b6;
            Text("Save change to the following items?");
            SetNextItemWidth(-1.0);
            bVar26 = ListBoxHeader("##",iVar40,6);
            if (bVar26) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar42 = 0;
                pvVar34 = DAT_001efb78;
                iVar40 = ShowExampleAppDocuments(bool*)::close_queue;
                do {
                  puVar46 = *(undefined8 **)((long)pvVar34 + lVar42 * 8);
                  if (*(char *)((long)puVar46 + 10) == '\x01') {
                    Text("%s",*puVar46);
                    pvVar34 = DAT_001efb78;
                    iVar40 = ShowExampleAppDocuments(bool*)::close_queue;
                  }
                  lVar42 = lVar42 + 1;
                } while (lVar42 < iVar40);
              }
              ListBoxFooter();
            }
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("Yes",(ImVec2 *)local_d8);
            pvVar34 = DAT_001efb78;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_001efb78 != (void *)0x0) goto LAB_001230c6;
              }
              else {
                lVar42 = 0;
                do {
                  lVar45 = *(long *)((long)pvVar34 + lVar42 * 8);
                  if (*(char *)(lVar45 + 10) == '\x01') {
                    *(undefined1 *)(lVar45 + 10) = 0;
                  }
                  *(undefined1 *)(lVar45 + 8) = 0;
                  *(undefined1 *)(lVar45 + 10) = 0;
                  lVar42 = lVar42 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar42);
LAB_001230c6:
                _close_queue = 0;
                MemFree(pvVar34);
                DAT_001efb78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("No",(ImVec2 *)local_d8);
            pvVar34 = DAT_001efb78;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_001efb78 != (void *)0x0) goto LAB_00123140;
              }
              else {
                lVar42 = 0;
                do {
                  lVar45 = *(long *)((long)pvVar34 + lVar42 * 8);
                  *(undefined1 *)(lVar45 + 8) = 0;
                  *(undefined1 *)(lVar45 + 10) = 0;
                  lVar42 = lVar42 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar42);
LAB_00123140:
                _close_queue = 0;
                MemFree(pvVar34);
                DAT_001efb78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8._0_8_ = SUB168(ZEXT416(0x42a00000),0);
            bVar26 = Button("Cancel",(ImVec2 *)local_d8);
            if (bVar26) {
              if (DAT_001efb78 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001efb78);
                DAT_001efb78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
LAB_001231b6:
    End();
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar26 = BeginMainMenuBar(), bVar26)) {
    bVar26 = BeginMenu("File",true);
    if (bVar26) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar26 = BeginMenu("Edit",true);
    if (bVar26) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar40 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar40 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_58 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar40 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar40 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar26 = SmallButton("[Debug] Add 5 entries");
    if (bVar26) {
      iVar40 = 5;
      do {
        uVar37 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar37
                  );
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar40 = iVar40 + -1;
      } while (iVar40 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_58;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar26) {
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          bVar26 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar26) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_d8._0_8_ = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)local_d8,true,0);
      uVar35 = 0;
      do {
        iVar40 = (int)uVar35;
        sprintf((char *)local_d8,"MyObject %d",uVar35);
        local_120.x = 0.0;
        local_120.y = 0.0;
        bVar26 = Selectable((char *)local_d8,iVar40 == ShowExampleAppLayout(bool*)::selected,0,
                            &local_120);
        if (bVar26) {
          ShowExampleAppLayout(bool*)::selected = iVar40;
        }
        uVar35 = (ulong)(iVar40 + 1U);
      } while (iVar40 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar50 = GetFrameHeightWithSpacing();
      local_d8._0_8_ = (ulong)((uint)fVar50 ^ (uint)DAT_001920f0) << 0x20;
      BeginChild("item view",(ImVec2 *)local_d8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar26 = BeginTabBar("##Tabs",0);
      if (bVar26) {
        bVar26 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar26) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar26 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar26) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_d8);
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_d8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_d8._0_4_ = 430.0;
    local_d8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    iVar40 = 0;
    bVar26 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar26) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_d8._0_4_ = 2.0;
      local_d8._4_4_ = 2.0;
      PushStyleVar(10,(ImVec2 *)local_d8);
      Columns(2,(char *)0x0,true);
      Separator();
      do {
        anon_func::funcs::ShowDummyObject("Object",iVar40);
        iVar40 = iVar40 + 1;
      } while (iVar40 != 3);
      Columns(1,(char *)0x0,true);
      Separator();
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_d8._0_4_ = 520.0;
    local_d8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar26) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar35 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar35 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar35)
      ;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Clear",(ImVec2 *)local_d8);
      if (bVar26) {
        if (DAT_001efb00 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_001efb00);
          DAT_001efb00 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Add 1000 lines",(ImVec2 *)local_d8);
      if (bVar26) {
        iVar40 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar40));
          iVar40 = iVar40 + 1;
        } while (iVar40 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_d8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          uVar35 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog",uVar35);
            uVar37 = (int)uVar35 + 1;
            uVar35 = (ulong)uVar37;
          } while ((int)uVar37 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_d8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar26 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar26) {
          uVar37 = (uint)local_c8;
          while( true ) {
            if (local_c8._4_4_ <= (int)uVar37) break;
            Text("%i The quick brown fox jumps over the lazy dog",(ulong)uVar37);
            uVar37 = uVar37 + 1;
          }
        }
        PopStyleVar(1);
        if ((float)local_d8._8_4_ != -NAN) goto LAB_00127617;
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        if (DAT_001efb00 == (char *)0x0) {
          pcVar44 = ImGuiTextBuffer::EmptyString;
          pcVar43 = ImGuiTextBuffer::EmptyString;
        }
        else {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x4ef,"const T &ImVector<char>::front() const [T = char]");
          }
          pcVar43 = DAT_001efb00 + (long)ShowExampleAppLongText(bool*)::log + -1;
          pcVar44 = DAT_001efb00;
        }
        TextUnformatted(pcVar44,pcVar43);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar26 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar26) {
      Text(
          "Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
          );
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d");
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar35 = 0;
        iVar40 = 0;
        do {
          Text("%*sThis is line %d",uVar35,"");
          iVar40 = iVar40 + 1;
          uVar35 = (ulong)((int)uVar35 + 4);
        } while (iVar40 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_d8._0_4_ = -1.0;
      local_d8._4_4_ = 0.0;
      local_120.x = -1.0;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)local_d8,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = -1.0;
      local_120.x = 3.4028235e+38;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_d8,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_d8._0_4_ = 100.0;
      local_d8._4_4_ = 100.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)local_d8,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_d8._0_4_ = 400.0;
      local_d8._4_4_ = -1.0;
      local_120.x = 500.0;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_d8,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_d8._0_4_ = -1.0;
      local_d8._4_4_ = 400.0;
      local_120.x = -1.0;
      local_120.y = 500.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_d8,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)local_d8,&local_120,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)local_d8,&local_120,
                 ShowExampleAppConstrainedResize::CustomConstraints::Step,(void *)0x64);
    }
    bVar26 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                   (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar26) {
      local_a8 = "Custom: Fixed Steps (100)";
      local_b8 = "Height 400-500";
      pcStack_b0 = "Custom: Always Square";
      local_c8 = "Width > 100, Height > 100";
      pcStack_c0 = "Width 400-500";
      local_d8._0_8_ = "Resize vertical only";
      local_d8._8_8_ = "Resize horizontal only";
      local_120.x = 0.0;
      local_120.y = 0.0;
      bVar26 = Button("200x200",&local_120);
      if (bVar26) {
        local_120.x = 200.0;
        local_120.y = 200.0;
        SetWindowSize(&local_120,0);
      }
      SameLine(0.0,-1.0);
      local_120.x = 0.0;
      local_120.y = 0.0;
      bVar26 = Button("500x500",&local_120);
      if (bVar26) {
        local_120.x = 500.0;
        local_120.y = 500.0;
        SetWindowSize(&local_120,0);
      }
      SameLine(0.0,-1.0);
      local_120.x = 0.0;
      local_120.y = 0.0;
      bVar26 = Button("800x200",&local_120);
      if (bVar26) {
        local_120.x = 800.0;
        local_120.y = 200.0;
        SetWindowSize(&local_120,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_d8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d");
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar35 = 0;
        iVar40 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar35,"");
          iVar40 = iVar40 + 1;
          uVar35 = (ulong)((int)uVar35 + 4);
        } while (iVar40 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar32 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) {
      uVar35 = CONCAT44(-(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0),
                        -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0));
      local_d8._0_8_ =
           (ulong)DAT_00196b10 & uVar35 |
           ~uVar35 & CONCAT44((pIVar32->DisplaySize).y + -10.0,(pIVar32->DisplaySize).x + -10.0);
      local_120 = (ImVec2)(~uVar35 & DAT_00192120);
      SetNextWindowPos((ImVec2 *)local_d8,1,&local_120);
    }
    SetNextWindowBgAlpha(0.35);
    bVar26 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,
                   (uint)(ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) * 4 + 0xc116b);
    if (bVar26) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar26 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar26) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar32->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar26 = BeginPopupContextWindow((char *)0x0,1,true);
      if (bVar26) {
        bVar26 = MenuItem("Custom",(char *)0x0,
                          ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar37 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar26 = MenuItem("Top-left",(char *)0x0,!bVar26 && uVar37 == 0,true);
        uVar37 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar26 = MenuItem("Top-right",(char *)0x0,!bVar26 && uVar37 == 1,true);
        uVar37 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar26 = MenuItem("Bottom-left",(char *)0x0,!bVar26 && uVar37 == 2,true);
        uVar37 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar26 = MenuItem("Bottom-right",(char *)0x0,!bVar26 && uVar37 == 3,true);
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar26 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar26) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 100.0;
    local_120.x = 0.0;
    local_120.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_120);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 200.0;
    local_120.x = 0.0;
    local_120.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_120);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar52 = GetTime();
    cVar36 = "|/-\\"[(int)(dVar52 * 4.0) & 3];
    uVar37 = GetFrameCount();
    sprintf(local_d8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar36,(ulong)uVar37);
    local_120.x = 100.0;
    local_120.y = 300.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    SetNextWindowPos(&local_120,4,&local_f0);
    Begin(local_d8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering == true) {
    bVar26 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
    if (bVar26) {
      pIVar33 = GetWindowDrawList();
      bVar26 = BeginTabBar("##TabBar",0);
      if (bVar26) {
        bVar26 = BeginTabItem("Primitives",(bool *)0x0,0);
        if (bVar26) {
          local_58 = p_open;
          if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
            ShowDemoWindow();
          }
          DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",1.0);
          DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,
                    "%.02f",1.0);
          ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
          IVar53 = GetCursorScreenPos();
          uStack_110 = extraout_XMM0_Qb;
          local_118._0_4_ = IVar53.x;
          local_118._4_4_ = IVar53.y;
          local_d8._0_8_ = ShowExampleAppCustomRendering(bool*)::colf._0_8_;
          local_d8._8_8_ = ShowExampleAppCustomRendering(bool*)::colf._8_8_;
          IVar29 = ColorConvertFloat4ToU32((ImVec4 *)local_d8);
          local_48 = (float)local_118._0_4_ + 4.0;
          fStack_44 = (float)local_118._4_4_;
          uStack_40 = (float)uStack_110;
          uStack_3c = uStack_110._4_4_;
          local_118._0_4_ = (float)local_118._4_4_ + 4.0;
          uStack_110._0_4_ = (float)local_118._4_4_;
          uStack_110._4_4_ = (float)local_118._4_4_;
          bVar26 = true;
          do {
            bVar27 = bVar26;
            fVar50 = 1.0;
            if (!bVar27) {
              fVar50 = ShowExampleAppCustomRendering(bool*)::thickness;
            }
            local_108._0_4_ = fVar50;
            fVar51 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_d8._0_4_ = fVar51 + local_48;
            local_d8._4_4_ = fVar51 + (float)local_118._0_4_;
            ImDrawList::AddCircle(pIVar33,(ImVec2 *)local_d8,fVar51,IVar29,6,fVar50);
            fVar51 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
            _local_e8 = ZEXT416((uint)fVar51);
            fVar50 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_d8._0_4_ = fVar50 + fVar51;
            local_d8._4_4_ = fVar50 + (float)local_118._0_4_;
            ImDrawList::AddCircle
                      (pIVar33,(ImVec2 *)local_d8,fVar50,IVar29,0x14,(float)local_108._0_4_);
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_
            ;
            _local_e8 = ZEXT416((uint)local_d8._0_4_);
            local_d8._4_4_ = local_118._0_4_;
            local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,0.0,0,
                                (float)local_108._0_4_);
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_
            ;
            _local_e8 = ZEXT416((uint)local_d8._0_4_);
            local_d8._4_4_ = local_118._0_4_;
            local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,10.0,0xf,
                                (float)local_108._0_4_);
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_
            ;
            _local_e8 = ZEXT416((uint)local_d8._0_4_);
            local_d8._4_4_ = local_118._0_4_;
            local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,10.0,9,
                                (float)local_108._0_4_);
            local_e8._0_4_ = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0
            ;
            local_e8._4_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_ + -0.5;
            fStack_e0 = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
            fStack_dc = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._4_4_ + 0.0;
            local_d8._4_4_ = local_118._0_4_;
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_e8._0_4_;
            local_120.y = (float)local_e8._4_4_;
            local_120.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
            local_f0.y = (float)local_e8._4_4_;
            local_f0.x = (float)local_e8._0_4_;
            ImDrawList::AddTriangle
                      (pIVar33,(ImVec2 *)local_d8,&local_120,&local_f0,IVar29,(float)local_108._0_4_
                      );
            local_120.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
            local_e8._0_4_ = local_120.x;
            local_d8._4_4_ = local_118._0_4_;
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.2 + local_120.x;
            local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
            local_f0.y = local_120.y;
            local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + local_120.x;
            ImDrawList::AddTriangle
                      (pIVar33,(ImVec2 *)local_d8,&local_120,&local_f0,IVar29,(float)local_108._0_4_
                      );
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + (float)local_e8._0_4_;
            _local_e8 = ZEXT416((uint)local_d8._0_4_);
            local_d8._4_4_ = local_118._0_4_;
            local_120.y = (float)local_118._0_4_;
            local_120.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
            ImDrawList::AddLine(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,(float)local_108._0_4_)
            ;
            local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_
            ;
            fStack_e0 = (float)local_e8._4_4_ + 0.0;
            local_e8._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            fStack_dc = (float)local_118._4_4_ + 0.0;
            local_d8._4_4_ = local_118._0_4_;
            local_d8._0_4_ = local_e8._0_4_;
            local_120.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_120.x = (float)local_e8._0_4_;
            ImDrawList::AddLine(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,(float)local_108._0_4_)
            ;
            local_e8._0_4_ = (float)local_e8._0_4_ + 10.0;
            local_d8._4_4_ = local_118._0_4_;
            local_d8._0_4_ = local_e8._0_4_;
            local_120.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
            local_120.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            ImDrawList::AddLine(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,(float)local_108._0_4_)
            ;
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_
            ;
            local_d8._4_4_ = local_118._0_4_;
            local_120.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_d8._0_4_;
            local_120.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + (float)local_118._0_4_;
            local_50.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_50.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_f0.x = local_50.x - ShowExampleAppCustomRendering(bool*)::sz * 1.3;
            local_f0.y = local_50.y - ShowExampleAppCustomRendering(bool*)::sz * 0.3;
            ImDrawList::AddBezierCurve
                      (pIVar33,(ImVec2 *)local_d8,&local_120,&local_f0,&local_50,IVar29,
                       (float)local_108._0_4_,0);
            local_118._0_4_ =
                 (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
            bVar26 = false;
          } while (bVar27);
          fVar50 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar50 + local_48;
          local_d8._4_4_ = fVar50 + (float)local_118._0_4_;
          ImDrawList::AddCircleFilled(pIVar33,(ImVec2 *)local_d8,fVar50,IVar29,6);
          local_48 = local_48 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          fVar50 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar50 + local_48;
          local_d8._4_4_ = fVar50 + (float)local_118._0_4_;
          ImDrawList::AddCircleFilled(pIVar33,(ImVec2 *)local_d8,fVar50,IVar29,0x20);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = local_118._0_4_;
          local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,0.0,0xf);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = local_118._0_4_;
          local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,10.0,0xf);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = local_118._0_4_;
          local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,10.0,9);
          local_108._0_4_ = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0
          ;
          local_108._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_ + -0.5
          ;
          uStack_100._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
          uStack_100._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._4_4_ + 0.0
          ;
          local_d8._4_4_ = local_118._0_4_;
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_108._0_4_;
          local_120.y = (float)local_108._4_4_;
          local_120.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          local_f0.y = (float)local_108._4_4_;
          local_f0.x = (float)local_108._0_4_;
          ImDrawList::AddTriangleFilled(pIVar33,(ImVec2 *)local_d8,&local_120,&local_f0,IVar29);
          local_120.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          local_108._0_4_ = local_120.x;
          local_d8._4_4_ = local_118._0_4_;
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.2 + local_120.x;
          local_120.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_f0.y = local_120.y;
          local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + local_120.x;
          ImDrawList::AddTriangleFilled(pIVar33,(ImVec2 *)local_d8,&local_120,&local_f0,IVar29);
          local_d8._0_4_ =
               ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = local_118._0_4_;
          local_120.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_120.y = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_118._0_4_;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,0.0,0xf);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = local_118._0_4_;
          local_120.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_d8._0_4_;
          local_120.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,0.0,0xf);
          local_108._0_4_ = (float)local_108._0_4_ + 20.0;
          local_d8._4_4_ = local_118._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_120.x = (float)local_108._0_4_ + 1.0;
          local_120.y = (float)local_118._0_4_ + 1.0;
          ImDrawList::AddRectFilled(pIVar33,(ImVec2 *)local_d8,&local_120,IVar29,0.0,0xf);
          local_d8._4_4_ = local_118._0_4_;
          local_d8._0_4_ = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_120.x = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                        ShowExampleAppCustomRendering(bool*)::sz;
          local_120.y = local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilledMultiColor
                    (pIVar33,(ImVec2 *)local_d8,&local_120,0xff000000,0xff0000ff,0xff00ffff,
                     0xff00ff00);
          local_d8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 9.8;
          local_d8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
          Dummy((ImVec2 *)local_d8);
          EndTabItem();
          p_open = local_58;
        }
        bVar26 = BeginTabItem("Canvas",(bool *)0x0,0);
        if (bVar26) {
          if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
            ShowDemoWindow();
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Clear",(ImVec2 *)local_d8);
          if ((bVar26) && (DAT_001efb40 != (void *)0x0)) {
            _points = 0;
            MemFree(DAT_001efb40);
            DAT_001efb40 = (void *)0x0;
          }
          if (1 < ShowExampleAppCustomRendering(bool*)::points) {
            SameLine(0.0,-1.0);
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("Undo",(ImVec2 *)local_d8);
            if (bVar26) {
              iVar40 = ShowExampleAppCustomRendering(bool*)::points;
              if (ShowExampleAppCustomRendering(bool*)::points < 1) goto LAB_00127574;
              iVar63 = ShowExampleAppCustomRendering(bool*)::points + -1;
              _points = CONCAT44(DAT_001efb3c,iVar63);
              if (iVar63 == 0) goto LAB_00127574;
              _points = CONCAT44(DAT_001efb3c,iVar40 + -2);
            }
          }
          Text("Left-click and drag to add lines,\nRight-click to undo");
          local_d8._0_8_ = GetCursorScreenPos();
          IVar53 = GetContentRegionAvail();
          fVar50 = IVar53.y;
          local_120 = IVar53;
          if (IVar53.x < 50.0) {
            local_120.y = fVar50;
            local_120.x = 50.0;
            IVar53.x = 50.0;
            IVar53.y = 0.0;
          }
          if (fVar50 < 50.0) {
            local_120.y = 50.0;
            fVar50 = 50.0;
          }
          local_f0.x = (float)local_d8._0_8_ + IVar53.x;
          local_f0.y = SUB84(local_d8._0_8_,4) + fVar50;
          ImDrawList::AddRectFilledMultiColor
                    (pIVar33,(ImVec2 *)local_d8,&local_f0,0xff323232,0xff3c3232,0xff463c3c,
                     0xff3c3232);
          local_f0.x = local_120.x + (float)local_d8._0_8_;
          local_f0.y = local_120.y + SUB84(local_d8._0_8_,4);
          ImDrawList::AddRect(pIVar33,(ImVec2 *)local_d8,&local_f0,0xffffffff,0.0,0xf,1.0);
          InvisibleButton("canvas",&local_120);
          pIVar32 = GetIO();
          local_108._0_4_ = (pIVar32->MousePos).x;
          local_108._4_4_ = (pIVar32->MousePos).y;
          unique0x10006188 = pIVar32->MouseDown[0];
          unique0x10006189 = pIVar32->MouseDown[1];
          unique0x1000618a = pIVar32->MouseDown[2];
          unique0x1000618b = pIVar32->MouseDown[3];
          unique0x1000618c = pIVar32->MouseDown[4];
          unique0x1000618d = *(undefined3 *)&pIVar32->field_0x135;
          _local_118 = ZEXT416((uint)local_d8._0_4_);
          pIVar32 = GetIO();
          local_f0.x = (float)local_108._0_4_ - (float)local_118._0_4_;
          local_f0.y = (pIVar32->MousePos).y - (float)local_d8._4_4_;
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            iVar40 = ShowExampleAppCustomRendering(bool*)::points;
            if (ShowExampleAppCustomRendering(bool*)::points == DAT_001efb3c) {
              if (ShowExampleAppCustomRendering(bool*)::points == 0) {
                iVar40 = 8;
              }
              else {
                iVar40 = ShowExampleAppCustomRendering(bool*)::points / 2 +
                         ShowExampleAppCustomRendering(bool*)::points;
              }
              iVar63 = ShowExampleAppCustomRendering(bool*)::points + 1;
              if (ShowExampleAppCustomRendering(bool*)::points + 1 < iVar40) {
                iVar63 = iVar40;
              }
              pvVar34 = MemAlloc((long)iVar63 << 3);
              if (DAT_001efb40 != (void *)0x0) {
                memcpy(pvVar34,DAT_001efb40,(long)ShowExampleAppCustomRendering(bool*)::points << 3)
                ;
                MemFree(DAT_001efb40);
              }
              _points = CONCAT44(iVar63,ShowExampleAppCustomRendering(bool*)::points);
              iVar40 = ShowExampleAppCustomRendering(bool*)::points;
              DAT_001efb40 = pvVar34;
            }
            *(ImVec2 *)((long)DAT_001efb40 + (long)iVar40 * 8) = local_f0;
            ShowExampleAppCustomRendering(bool*)::points =
                 ShowExampleAppCustomRendering(bool*)::points + 1;
            bVar27 = IsMouseDown(0);
            bVar26 = true;
            if (!bVar27) {
              ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
              goto LAB_00124dfd;
            }
          }
          else {
LAB_00124dfd:
            bVar26 = false;
          }
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            if ((ShowExampleAppCustomRendering(bool*)::adding_line == '\0') &&
               (bVar27 = IsMouseClicked(0,false), bVar27)) {
              ImVector<ImVec2>::push_back
                        ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_f0
                        );
              ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
            }
            bVar27 = IsMouseClicked(1,false);
            if ((bVar27) &&
               (iVar40 = ShowExampleAppCustomRendering(bool*)::points,
               ShowExampleAppCustomRendering(bool*)::points != 0)) {
              ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
              if (ShowExampleAppCustomRendering(bool*)::points < 1) goto LAB_00127574;
              iVar63 = ShowExampleAppCustomRendering(bool*)::points + -1;
              _points = CONCAT44(DAT_001efb3c,iVar63);
              if (iVar63 == 0) goto LAB_00127574;
              _points = CONCAT44(DAT_001efb3c,iVar40 + -2);
              bVar26 = false;
            }
          }
          cr_max.x = local_120.x + (float)local_d8._0_8_;
          cr_max.y = local_120.y + SUB84(local_d8._0_8_,4);
          ImDrawList::PushClipRect(pIVar33,(ImVec2)local_d8._0_8_,cr_max,true);
          uVar35 = _points & 0xffffffff;
          if (1 < ShowExampleAppCustomRendering(bool*)::points) {
            lVar42 = 1;
            do {
              uVar1 = *(undefined8 *)((long)DAT_001efb40 + lVar42 * 8 + -8);
              local_50.x = (float)uVar1 + (float)local_d8._0_8_;
              local_50.y = (float)((ulong)uVar1 >> 0x20) + SUB84(local_d8._0_8_,4);
              if ((int)uVar35 <= lVar42) {
                __assert_fail("i < Size",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                              ,0x4e6,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
              }
              uVar1 = *(undefined8 *)((long)DAT_001efb40 + lVar42 * 8);
              local_38.x = (float)local_d8._0_8_ + (float)uVar1;
              local_38.y = SUB84(local_d8._0_8_,4) + (float)((ulong)uVar1 >> 0x20);
              ImDrawList::AddLine(pIVar33,&local_50,&local_38,0xff00ffff,2.0);
              uVar35 = (ulong)ShowExampleAppCustomRendering(bool*)::points;
              lVar45 = lVar42 + 1;
              lVar42 = lVar42 + 2;
            } while (lVar45 < (long)(uVar35 - 1));
          }
          ImDrawList::PopClipRect(pIVar33);
          if (bVar26) {
            if (ShowExampleAppCustomRendering(bool*)::points < 1) {
LAB_00127574:
              __assert_fail("Size > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                            ,0x4fb,"void ImVector<ImVec2>::pop_back() [T = ImVec2]");
            }
            _points = CONCAT44(DAT_001efb3c,ShowExampleAppCustomRendering(bool*)::points + -1);
          }
          EndTabItem();
        }
        bVar26 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
        if (bVar26) {
          Checkbox("Draw in Background draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
          SameLine(0.0,-1.0);
          HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
          Checkbox("Draw in Foreground draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
          SameLine(0.0,-1.0);
          HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
          IVar53 = GetWindowPos();
          uStack_100 = extraout_XMM0_Qb_00;
          local_108._0_4_ = IVar53.x;
          local_108._4_4_ = IVar53.y;
          IVar53 = GetWindowSize();
          uStack_110 = extraout_XMM0_Qb_01;
          local_118._0_4_ = IVar53.x;
          local_118._4_4_ = IVar53.y;
          local_d8._0_4_ = IVar53.x * 0.5 + (float)local_108._0_4_;
          local_d8._4_4_ = IVar53.y * 0.5 + (float)local_108._4_4_;
          if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
            pIVar33 = GetBackgroundDrawList();
            ImDrawList::AddCircle
                      (pIVar33,(ImVec2 *)local_d8,(float)local_118._0_4_ * 0.6,0xc80000ff,0x30,14.0)
            ;
          }
          if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
            pIVar33 = GetForegroundDrawList();
            ImDrawList::AddCircle
                      (pIVar33,(ImVec2 *)local_d8,(float)local_118._4_4_ * 0.6,0xc800ff00,0x30,10.0)
            ;
          }
          EndTabItem();
        }
        EndTabBar();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  uVar37 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar37 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar47 = uVar37 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar47 = uVar37;
  }
  uVar37 = uVar47 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar37 = uVar47;
  }
  uVar47 = uVar37 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar47 = uVar37;
  }
  uVar37 = uVar47 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar37 = uVar47;
  }
  uVar47 = uVar37 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar47 = uVar37;
  }
  uVar37 = uVar47 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar37 = uVar47;
  }
  uVar47 = uVar37 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar47 = uVar37;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  local_d8._0_4_ = 650.0;
  local_d8._4_4_ = 20.0;
  local_120.x = 0.0;
  local_120.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_d8,4,&local_120);
  local_d8._0_4_ = 550.0;
  local_d8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_d8,4);
  bVar26 = Begin("Dear ImGui Demo",p_open,uVar47);
  if (bVar26) {
    fVar50 = GetFontSize();
    PushItemWidth(fVar50 * -12.0);
    bVar26 = BeginMenuBar();
    if (bVar26) {
      bVar26 = BeginMenu("Menu",true);
      if (bVar26) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar26 = BeginMenu("Examples",true);
      if (bVar26) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar26 = BeginMenu("Tools",true);
      if (bVar26) {
        MenuItem("Metrics",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar26 = CollapsingHeader("Help",0);
    if (bVar26) {
      Text("PROGRAMMER GUIDE:");
      BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("Please see the comments in imgui.cpp.");
      BulletText("Please see the examples/ application.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar26 = CollapsingHeader("Configuration",0);
    if (bVar26) {
      pIVar32 = GetIO();
      bVar26 = TreeNode("Configuration##2");
      if (bVar26) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",(uint *)pIVar32,1);
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",(uint *)pIVar32,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",(uint *)pIVar32,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",(uint *)pIVar32,0x10);
        if ((pIVar32->ConfigFlags & 0x10) != 0) {
          dVar52 = GetTime();
          fVar50 = fmodf((float)dVar52,0.4);
          if (fVar50 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar40 = GetKeyIndex(0xc);
          bVar26 = IsKeyPressed(iVar40,true);
          if (bVar26) {
            *(byte *)&pIVar32->ConfigFlags = (byte)pIVar32->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",(uint *)pIVar32,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar32->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting")
        ;
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar32->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar32->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar32->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Backend Flags");
      if (bVar26) {
        HelpMarker(
                  "Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities."
                  );
        local_d8._0_4_ = pIVar32->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(uint *)local_d8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(uint *)local_d8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(uint *)local_d8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(uint *)local_d8,8);
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Style");
      if (bVar26) {
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Capture/Logging");
      if (bVar26) {
        TextWrapped(
                   "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded."
                   );
        HelpMarker(
                  "Try opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        TextWrapped(
                   "You can also call ImGui::LogText() to output directly to the log without a visual output."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_d8);
        if (bVar26) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar26 = CollapsingHeader("Window options",0);
    if (bVar26) {
      Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
      SameLine(150.0,-1.0);
      Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
      SameLine(300.0,-1.0);
      Checkbox("No menu",&ShowDemoWindow::no_menu);
      Checkbox("No move",&ShowDemoWindow::no_move);
      SameLine(150.0,-1.0);
      Checkbox("No resize",&ShowDemoWindow::no_resize);
      SameLine(300.0,-1.0);
      Checkbox("No collapse",&ShowDemoWindow::no_collapse);
      Checkbox("No close",&ShowDemoWindow::no_close);
      SameLine(150.0,-1.0);
      Checkbox("No nav",&ShowDemoWindow::no_nav);
      SameLine(300.0,-1.0);
      Checkbox("No background",&ShowDemoWindow::no_background);
      Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar26 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar26) {
      bVar26 = TreeNode("Popups");
      if (bVar26) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Select..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_select_popup");
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar44 = "<None>";
        }
        else {
          pcVar44 = (&PTR_anon_var_dwarf_34dfe_001e89e0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar44,(char *)0x0);
        bVar26 = BeginPopup("my_select_popup",0);
        if (bVar26) {
          lVar42 = 0;
          Text("Aquarium");
          Separator();
          ppuVar49 = &PTR_anon_var_dwarf_34dfe_001e89e0;
          do {
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Selectable(*ppuVar49,false,0,(ImVec2 *)local_d8);
            if (bVar26) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar42;
            }
            lVar42 = lVar42 + 1;
            ppuVar49 = ppuVar49 + 1;
          } while (lVar42 != 5);
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Toggle..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_toggle_popup");
        }
        bVar26 = BeginPopup("my_toggle_popup",0);
        if (bVar26) {
          pbVar41 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar42 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_34dfe_001e89e0 + lVar42),"",pbVar41,true);
            lVar42 = lVar42 + 8;
            pbVar41 = pbVar41 + 1;
          } while (lVar42 != 0x28);
          bVar26 = BeginMenu("Sub-menu",true);
          if (bVar26) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
          if (bVar26) {
            OpenPopup("another popup");
          }
          bVar26 = BeginPopup("another popup",0);
          if (bVar26) {
            pbVar41 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar42 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_34dfe_001e89e0 + lVar42),"",pbVar41,true
                      );
              lVar42 = lVar42 + 8;
              pbVar41 = pbVar41 + 1;
            } while (lVar42 != 0x28);
            bVar26 = BeginMenu("Sub-menu",true);
            if (bVar26) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
              if (bVar26) {
                OpenPopup("another popup");
              }
              bVar26 = BeginPopup("another popup",0);
              if (bVar26) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("File Menu..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_file_popup");
        }
        bVar26 = BeginPopup("my_file_popup",0);
        if (bVar26) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar26 = TreeNode("Context menus");
      if (bVar26) {
        Text("Value = %.3f (<-- right-click here)",(double)ShowDemoWindowPopups()::value);
        bVar26 = BeginPopupContextItem("item context menu",1);
        if (bVar26) {
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to zero",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to PI",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",1.0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf(local_d8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_120.x = 0.0;
        local_120.y = 0.0;
        Button(local_d8,&local_120);
        bVar26 = BeginPopupContextItem((char *)0x0,1);
        if (bVar26) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_120.x = 0.0;
          local_120.y = 0.0;
          bVar26 = Button("Close",&local_120);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar26 = TreeNode("Modals");
      if (bVar26) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside the window."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Delete..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("Delete?");
        }
        bVar26 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar26) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          PushStyleVar(10,(ImVec2 *)local_d8);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_d8._0_4_ = 120.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("OK",(ImVec2 *)local_d8);
          if (bVar26) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_d8._0_4_ = 120.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Cancel",(ImVec2 *)local_d8);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Stacked modals..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("Stacked 1");
        }
        bVar26 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar26) {
          bVar26 = BeginMenuBar();
          if (bVar26) {
            bVar26 = BeginMenu("File",true);
            if (bVar26) {
              MenuItem("Dummy menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Add another modal..",(ImVec2 *)local_d8);
          if (bVar26) {
            OpenPopup("Stacked 2");
          }
          local_120.x._0_1_ = 1;
          bVar26 = BeginPopupModal("Stacked 2",(bool *)&local_120,0);
          if (bVar26) {
            Text("Hello from Stacked The Second!");
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("Close",(ImVec2 *)local_d8);
            if (bVar26) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Close",(ImVec2 *)local_d8);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar26 = TreeNode("Menus inside a regular window");
      if (bVar26) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar26 = BeginMenu("Menu inside a regular window",true);
        if (bVar26) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    bVar26 = CollapsingHeader("Columns",0);
    if (bVar26) {
      PushID("Columns");
      Checkbox("Disable tree indentation",(bool *)&ShowDemoWindowColumns()::disable_indent);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Disable the indenting of tree nodes so demo columns can use the full window width."
                );
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PushStyleVar(0xf,0.0);
      }
      bVar26 = TreeNode("Basic");
      if (bVar26) {
        Text("Without border:");
        Columns(3,"mycolumns3",false);
        Separator();
        uVar35 = 0;
        do {
          sprintf(local_d8,"Item %d",uVar35);
          local_120.x = 0.0;
          local_120.y = 0.0;
          Selectable(local_d8,false,0,&local_120);
          NextColumn();
          uVar37 = (int)uVar35 + 1;
          uVar35 = (ulong)uVar37;
        } while (uVar37 != 0xe);
        Columns(1,(char *)0x0,true);
        Separator();
        Text("With border:");
        Columns(4,"mycolumns",true);
        Separator();
        Text("ID");
        NextColumn();
        Text("Name");
        NextColumn();
        Text("Path");
        NextColumn();
        Text("Hovered");
        NextColumn();
        Separator();
        lVar42 = 0;
        uVar35 = 0;
        do {
          sprintf(local_d8,"%04d",uVar35 & 0xffffffff);
          local_120.x = 0.0;
          local_120.y = 0.0;
          bVar26 = Selectable(local_d8,uVar35 == ShowDemoWindowColumns()::selected,2,&local_120);
          if (bVar26) {
            ShowDemoWindowColumns()::selected = (uint)uVar35;
          }
          IsItemHovered(0);
          NextColumn();
          Text((char *)((long)&DAT_0019e82c + (long)*(int *)((long)&DAT_0019e82c + lVar42)));
          NextColumn();
          Text((char *)((long)&DAT_0019e838 + (long)*(int *)((long)&DAT_0019e838 + lVar42)));
          NextColumn();
          Text("%d");
          NextColumn();
          uVar35 = uVar35 + 1;
          lVar42 = lVar42 + 4;
        } while (lVar42 != 0xc);
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar26 = TreeNode("Borders");
      if (bVar26) {
        fVar50 = GetFontSize();
        SetNextItemWidth(fVar50 * 8.0);
        DragInt("##columns_count",&ShowDemoWindowColumns()::columns_count,0.1,2,10,"%d columns");
        if (ShowDemoWindowColumns()::columns_count < 2) {
          ShowDemoWindowColumns()::columns_count = 2;
        }
        SameLine(0.0,-1.0);
        Checkbox("horizontal",(bool *)&ShowDemoWindowColumns()::h_borders);
        SameLine(0.0,-1.0);
        Checkbox("vertical",(bool *)&ShowDemoWindowColumns()::v_borders);
        Columns(ShowDemoWindowColumns()::columns_count,(char *)0x0,
                (bool)ShowDemoWindowColumns()::v_borders);
        if (0 < ShowDemoWindowColumns()::columns_count) {
          iVar40 = 0;
          do {
            if ((ShowDemoWindowColumns()::h_borders == '\x01') &&
               (iVar63 = GetColumnIndex(), iVar63 == 0)) {
              Separator();
            }
            Text("%c%c%c",(ulong)(iVar40 + 0x61U),(ulong)(iVar40 + 0x61U));
            fVar50 = GetColumnWidth(-1);
            Text("Width %.2f",(double)fVar50);
            IVar53 = GetContentRegionAvail();
            Text("Avail %.2f",(double)IVar53.x);
            fVar50 = GetColumnOffset(-1);
            Text("Offset %.2f",(double)fVar50);
            Text("Long text that is likely to clip");
            local_d8._0_4_ = -1.1754944e-38;
            local_d8._4_4_ = 0.0;
            Button("Button",(ImVec2 *)local_d8);
            NextColumn();
            iVar40 = iVar40 + 1;
          } while (SBORROW4(iVar40,ShowDemoWindowColumns()::columns_count * 3) !=
                   iVar40 + ShowDemoWindowColumns()::columns_count * -3 < 0);
        }
        Columns(1,(char *)0x0,true);
        if (ShowDemoWindowColumns()::h_borders != '\0') {
          Separator();
        }
        TreePop();
      }
      bVar26 = TreeNode("Mixed items");
      if (bVar26) {
        Columns(3,"mixed",true);
        Separator();
        Text("Hello");
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Banana",(ImVec2 *)local_d8);
        NextColumn();
        Text("ImGui");
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Apple",(ImVec2 *)local_d8);
        InputFloat("red",(float *)&ShowDemoWindowColumns()::foo,0.05,0.0,"%.3f",0);
        Text("An extra line here.");
        NextColumn();
        Text("Sailor");
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Corniflower",(ImVec2 *)local_d8);
        InputFloat("blue",(float *)&ShowDemoWindowColumns()::bar,0.05,0.0,"%.3f",0);
        NextColumn();
        bVar26 = CollapsingHeader("Category A",0);
        if (bVar26) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar26 = CollapsingHeader("Category B",0);
        if (bVar26) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar26 = CollapsingHeader("Category C",0);
        if (bVar26) {
          Text("Blah blah blah");
        }
        NextColumn();
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar26 = TreeNode("Word-wrapping");
      if (bVar26) {
        Columns(2,"word-wrapping",true);
        Separator();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Left");
        NextColumn();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Right");
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar26 = TreeNode("Horizontal Scrolling");
      if (bVar26) {
        local_d8._0_4_ = 1500.0;
        local_d8._4_4_ = 0.0;
        SetNextWindowContentSize((ImVec2 *)local_d8);
        fVar50 = GetFontSize();
        local_d8._0_8_ = (ulong)(uint)(fVar50 * 20.0) << 0x20;
        BeginChild("##ScrollingRegion",(ImVec2 *)local_d8,false,0x800);
        Columns(10,(char *)0x0,true);
        ImGuiListClipper::Begin((ImGuiListClipper *)local_d8,2000,-1.0);
        while (bVar26 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar26) {
          uVar37 = (uint)local_c8;
          while( true ) {
            if (local_c8._4_4_ <= (int)uVar37) break;
            uVar35 = 0;
            do {
              Text("Line %d Column %d...",(ulong)uVar37,uVar35);
              NextColumn();
              uVar47 = (int)uVar35 + 1;
              uVar35 = (ulong)uVar47;
            } while (uVar47 != 10);
            uVar37 = uVar37 + 1;
          }
        }
        Columns(1,(char *)0x0,true);
        EndChild();
        TreePop();
        if ((float)local_d8._8_4_ != -NAN) {
LAB_00127617:
          __assert_fail("ItemsCount == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x6b8,"ImGuiListClipper::~ImGuiListClipper()");
        }
      }
      bVar26 = TreeNode("Tree");
      if (bVar26) {
        Columns(2,"tree",true);
        pvVar34 = (void *)0x0;
        do {
          bVar26 = TreeNode(pvVar34,"Node%d",(ulong)pvVar34 & 0xffffffff);
          NextColumn();
          Text("Node contents");
          NextColumn();
          if (bVar26) {
            ptr_id = (void *)0x0;
            do {
              bVar26 = TreeNode(ptr_id,"Node%d.%d",(ulong)pvVar34 & 0xffffffff);
              NextColumn();
              Text("Node contents");
              if (bVar26) {
                Text("Even more contents");
                bVar26 = TreeNode("Tree in column");
                if (bVar26) {
                  Text("The quick brown fox jumps over the lazy dog");
                  TreePop();
                }
                NextColumn();
                TreePop();
              }
              else {
                NextColumn();
              }
              ptr_id = (void *)((long)ptr_id + 1);
            } while (ptr_id != (void *)0x3);
            TreePop();
          }
          pvVar34 = (void *)((long)pvVar34 + 1);
        } while (pvVar34 != (void *)0x3);
        Columns(1,(char *)0x0,true);
        TreePop();
      }
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PopStyleVar(1);
      }
      PopID();
    }
    bVar26 = CollapsingHeader("Filtering",0);
    if (bVar26) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar40 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar40 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar42 = 0;
      do {
        bVar26 = ImGuiTextFilter::PassFilter
                           ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                            *(char **)((long)&PTR_anon_var_dwarf_35414_001e8a10 + lVar42),
                            (char *)0x0);
        if (bVar26) {
          BulletText("%s");
        }
        lVar42 = lVar42 + 8;
      } while (lVar42 != 0x40);
    }
    bVar26 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar26) {
      pIVar32 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar32->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar32->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar32->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar32->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar32->NavActive,(ulong)pIVar32->NavVisible);
      bVar26 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar26) {
        bVar26 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar26) {
          Text("Mouse pos: (%g, %g)",(double)(pIVar32->MousePos).x,(double)(pIVar32->MousePos).y);
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)(pIVar32->MouseDelta).x);
        lVar42 = 0;
        Text("Mouse down:");
        do {
          if (0.0 <= pIVar32->MouseDownDuration[lVar42]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)pIVar32->MouseDownDuration[lVar42]);
          }
          lVar42 = lVar42 + 1;
        } while (lVar42 != 5);
        Text("Mouse clicked:");
        iVar40 = 0;
        do {
          bVar26 = IsMouseClicked(iVar40,false);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar40 = iVar40 + 1;
        } while (iVar40 != 5);
        Text("Mouse dbl-clicked:");
        uVar37 = 0;
        do {
          bVar26 = IsMouseDoubleClicked(uVar37);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar37);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != 5);
        Text("Mouse released:");
        uVar37 = 0;
        do {
          bVar26 = IsMouseReleased(uVar37);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar37);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != 5);
        Text("Mouse wheel: %.1f",(double)pIVar32->MouseWheel);
        uVar35 = 0;
        Text("Keys down:");
        do {
          if (0.0 <= pIVar32->KeysDownDuration[uVar35]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",(double)pIVar32->KeysDownDuration[uVar35],
                 uVar35 & 0xffffffff,uVar35 & 0xffffffff);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != 0x200);
        Text("Keys pressed:");
        uVar37 = 0;
        do {
          bVar26 = IsKeyPressed(uVar37,true);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar37,(ulong)uVar37);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != 0x200);
        Text("Keys release:");
        uVar35 = 0;
        do {
          bVar26 = IsKeyReleased((int)uVar35);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar35,uVar35);
          }
          uVar37 = (int)uVar35 + 1;
          uVar35 = (ulong)uVar37;
        } while (uVar37 != 0x200);
        pcVar44 = "CTRL ";
        if (pIVar32->KeyCtrl == false) {
          pcVar44 = "";
        }
        pcVar43 = "SHIFT ";
        if (pIVar32->KeyShift == false) {
          pcVar43 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar44,pcVar43);
        Text("Chars queue:");
        if (0 < (pIVar32->InputQueueCharacters).Size) {
          lVar42 = 0;
          do {
            uVar2 = (pIVar32->InputQueueCharacters).Data[lVar42];
            SameLine(0.0,-1.0);
            uVar37 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar37 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar37,(ulong)uVar2);
            lVar42 = lVar42 + 1;
          } while (lVar42 < (pIVar32->InputQueueCharacters).Size);
        }
        uVar35 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar32->NavInputs[uVar35]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar32->NavInputs[uVar35],uVar35 & 0xffffffff);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != 0x15);
        Text("NavInputs pressed:");
        uVar35 = 0;
        do {
          if ((pIVar32->NavInputsDownDuration[uVar35] == 0.0) &&
             (!NAN(pIVar32->NavInputsDownDuration[uVar35]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar35 & 0xffffffff);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != 0x15);
        uVar35 = 0;
        Text("NavInputs duration:");
        do {
          if (0.0 <= pIVar32->NavInputsDownDuration[uVar35]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar32->NavInputsDownDuration[uVar35],uVar35 & 0xffffffff);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != 0x15);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemHovered(0);
        if (bVar26) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar26 = TreeNode("Tabbing");
      if (bVar26) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar26 = TreeNode("Focus from code");
      if (bVar26) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on 1",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on 2",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar28 = Button("Focus on 3",(ImVec2 *)local_d8);
        if (bVar26) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        uVar37 = (uint)bVar26;
        if (bVar27) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar37 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar28) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar37 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar37 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar37);
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on X",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on Y",(ImVec2 *)local_d8);
        iVar40 = 1;
        if (!bVar27) {
          iVar40 = bVar26 - 1;
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on Z",(ImVec2 *)local_d8);
        iVar63 = 2;
        if (!bVar26) {
          iVar63 = iVar40;
        }
        if (iVar63 != -1) {
          SetKeyboardFocusHere(iVar63);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",1.0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar26 = TreeNode("Dragging");
      if (bVar26) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar37 = 0;
        do {
          bVar26 = IsMouseDragging(uVar37,-1.0);
          bVar27 = IsMouseDragging(uVar37,0.0);
          bVar28 = IsMouseDragging(uVar37,20.0);
          Text("IsMouseDragging(%d):\n  w/ default threshold: %d,\n  w/ zero threshold: %d\n  w/ large threshold: %d"
               ,(ulong)uVar37,(ulong)bVar26,(ulong)bVar27,(ulong)bVar28);
          uVar37 = uVar37 + 1;
        } while (uVar37 != 3);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          pIVar33 = GetForegroundDrawList();
          IVar29 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar33,pIVar32->MouseClickedPos,&pIVar32->MousePos,IVar29,4.0);
        }
        IVar53 = GetMouseDragDelta(0,0.0);
        uStack_110 = extraout_XMM0_Qb_02;
        local_118._0_4_ = IVar53.x;
        local_118._4_4_ = IVar53.y;
        GetMouseDragDelta(0,-1.0);
        Text(
            "GetMouseDragDelta(0):\n  w/ default threshold: (%.1f, %.1f),\n  w/ zero threshold: (%.1f, %.1f)\nMouseDelta: (%.1f, %.1f)"
            );
        TreePop();
      }
      bVar26 = TreeNode("Mouse cursors");
      if (bVar26) {
        uVar37 = GetMouseCursor();
        IVar30 = GetMouseCursor();
        puVar46 = &DAT_001e8a50;
        Text("Current mouse cursor = %d: %s",(ulong)uVar37,(&DAT_001e8a50)[IVar30]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar35 = 0;
        do {
          sprintf(local_d8,"Mouse cursor %d: %s",uVar35 & 0xffffffff,*puVar46);
          Bullet();
          local_120.x = 0.0;
          local_120.y = 0.0;
          Selectable(local_d8,false,0,&local_120);
          bVar26 = IsItemHovered(0);
          if ((bVar26) || (bVar26 = IsItemFocused(), bVar26)) {
            SetMouseCursor((ImGuiMouseCursor)uVar35);
          }
          uVar35 = uVar35 + 1;
          puVar46 = puVar46 + 1;
        } while (uVar35 != 8);
        TreePop();
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!"); // Exceptionally add an extra assert here for people confused with initial dear imgui setup

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_documents = false;
    static bool show_app_main_menu_bar = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);
    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)             { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_style_editor)        { ImGui::Begin("Style Editor", &show_app_style_editor); ImGui::ShowStyleEditor(); ImGui::End(); }
    if (show_app_about)               { ImGui::ShowAboutWindow(&show_app_about); }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file. Typically this isn't required! We only do it to make the Demo applications a little more welcoming.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default.
    //ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.65f);    // Use 2/3 of the space for widgets and 1/3 for labels (default)
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);           // Use fixed width for labels (by passing a negative value), the rest goes to widgets. We choose a width proportional to our font size.

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("Please see the comments in imgui.cpp.");
        ImGui::BulletText("Please see the examples/ application.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse) // Create a way to restore this flag otherwise we could be stuck completely!
            {
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker("Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities.");
            ImGuiBackendFlags backend_flags = io.BackendFlags; // Make a local copy to avoid modifying actual back-end flags.
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", (unsigned int *)&backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            ImGui::TextWrapped("The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.");
            HelpMarker("Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();
            ImGui::TextWrapped("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        ImGui::Checkbox("No titlebar", &no_titlebar); ImGui::SameLine(150);
        ImGui::Checkbox("No scrollbar", &no_scrollbar); ImGui::SameLine(300);
        ImGui::Checkbox("No menu", &no_menu);
        ImGui::Checkbox("No move", &no_move); ImGui::SameLine(150);
        ImGui::Checkbox("No resize", &no_resize); ImGui::SameLine(300);
        ImGui::Checkbox("No collapse", &no_collapse);
        ImGui::Checkbox("No close", &no_close); ImGui::SameLine(150);
        ImGui::Checkbox("No nav", &no_nav); ImGui::SameLine(300);
        ImGui::Checkbox("No background", &no_background);
        ImGui::Checkbox("No bring to front", &no_bring_to_front);
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowColumns();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::End();
}